

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixGetTempname(int nBuf,char *zBuf)

{
  bool bVar1;
  sqlite3_mutex *psVar2;
  int iVar3;
  undefined8 local_30;
  u64 r;
  int rc;
  int iLimit;
  char *zDir;
  char *zBuf_local;
  int nBuf_local;
  
  r._4_4_ = 0;
  r._0_4_ = 0;
  *zBuf = '\0';
  zDir = zBuf;
  zBuf_local._4_4_ = nBuf;
  psVar2 = sqlite3MutexAlloc(0xb);
  sqlite3_mutex_enter(psVar2);
  _rc = unixTempFileDir();
  if (_rc == (char *)0x0) {
    r._0_4_ = 0x190a;
  }
  else {
    do {
      sqlite3_randomness(8,&local_30);
      zDir[zBuf_local._4_4_ + -2] = '\0';
      sqlite3_snprintf(zBuf_local._4_4_,zDir,"%s/etilqs_%llx%c",_rc,local_30,0);
      if ((zDir[zBuf_local._4_4_ + -2] != '\0') ||
         (iVar3 = r._4_4_ + 1, bVar1 = 10 < r._4_4_, r._4_4_ = iVar3, bVar1)) {
        r._0_4_ = 1;
        break;
      }
      iVar3 = (*aSyscall[2].pCurrent)(zDir,0);
    } while (iVar3 == 0);
  }
  psVar2 = sqlite3MutexAlloc(0xb);
  sqlite3_mutex_leave(psVar2);
  return (int)r;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;
  int rc = SQLITE_OK;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing.
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  sqlite3_mutex_enter(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  zDir = unixTempFileDir();
  if( zDir==0 ){
    rc = SQLITE_IOERR_GETTEMPPATH;
  }else{
    do{
      u64 r;
      sqlite3_randomness(sizeof(r), &r);
      assert( nBuf>2 );
      zBuf[nBuf-2] = 0;
      sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                       zDir, r, 0);
      if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ){
        rc = SQLITE_ERROR;
        break;
      }
    }while( osAccess(zBuf,0)==0 );
  }
  sqlite3_mutex_leave(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_TEMPDIR));
  return rc;
}